

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cxx
# Opt level: O0

void __thiscall vigra::BmpDecoderImpl::read_data(BmpDecoderImpl *this)

{
  long in_RDI;
  BmpDecoderImpl *in_stack_00000020;
  BmpDecoderImpl *in_stack_00000030;
  BmpDecoderImpl *in_stack_00000040;
  BmpDecoderImpl *in_stack_00000060;
  BmpDecoderImpl *in_stack_00000080;
  
  switch(*(undefined2 *)(in_RDI + 0x222)) {
  case 1:
    read_1bit_data(in_stack_00000040);
    break;
  case 4:
    if (*(int *)(in_RDI + 0x224) == 0) {
      read_4bit_data(in_stack_00000040);
    }
    else {
      read_rle4_data(in_stack_00000080);
    }
    break;
  case 8:
    if (*(int *)(in_RDI + 0x224) == 0) {
      read_8bit_data(in_stack_00000030);
    }
    else {
      read_rle8_data(in_stack_00000060);
    }
    break;
  case 0x18:
    read_rgb_data(in_stack_00000020);
  }
  *(undefined1 *)(in_RDI + 0x275) = 1;
  return;
}

Assistant:

void BmpDecoderImpl::read_data ()
{
    // read (and eventually map) the bands
    switch (info_header.bit_count) {
    case 1:
        read_1bit_data ();
        break;
    case 4:
        if (info_header.compression) {
            read_rle4_data ();
        } else {
            read_4bit_data ();
        } break;
    case 8:
        if (info_header.compression) {
            read_rle8_data ();
        } else {
            read_8bit_data ();
        } break;
    case 24:
        read_rgb_data ();
        break;
    }
    data_read = true;
}